

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyd_socket_request.cc
# Opt level: O3

void __thiscall CSocekt::tmpoutMsgRecvQueue(CSocekt *this)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *point;
  CMemory *this_00;
  int iVar3;
  
  if (((this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl._M_node.
       super__List_node_base._M_next != (_List_node_base *)&this->m_MsgRecvQueue) &&
     (iVar3 = (int)(this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
                   _M_node._M_size, 999 < iVar3)) {
    this_00 = CMemory::GetInstance();
    iVar3 = iVar3 + -500;
    do {
      p_Var2 = (this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
               _M_node.super__List_node_base._M_next;
      point = p_Var2[1]._M_next;
      psVar1 = &(this->m_MsgRecvQueue).super__List_base<char_*,_std::allocator<char_*>_>._M_impl.
                _M_node._M_size;
      *psVar1 = *psVar1 - 1;
      std::__detail::_List_node_base::_M_unhook();
      operator_delete(p_Var2);
      CMemory::FreeMemory(this_00,point);
      iVar3 = iVar3 + -1;
    } while (iVar3 != 0);
  }
  return;
}

Assistant:

void CSocekt::tmpoutMsgRecvQueue()
{
    //日后可能引入outMsgRecvQueue()，这个函数可能需要临界......
    if(m_MsgRecvQueue.empty())  //没有消息直接退出
    {
        return;
    }
    int size = m_MsgRecvQueue.size();
    if(size < 1000) //消息不超过1000条就不处理先
    {
        return;
    }
    //消息达到1000条
    CMemory *p_memory = CMemory::GetInstance();
    int cha = size - 500;
    for(int i = 0; i < cha; ++i)
    {
        //一次干掉一堆
        char *sTmpMsgBuf = m_MsgRecvQueue.front();//返回第一个元素但不检查元素存在与否
        m_MsgRecvQueue.pop_front();               //移除第一个元素但不返回
        p_memory->FreeMemory(sTmpMsgBuf);         //先释放掉把；
    }
    return;
}